

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  undefined8 uVar4;
  int iVar5;
  DataKey DVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  long lVar7;
  long lVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_188;
  DataKey local_150;
  ulong local_148;
  cpp_dec_float<50U,_int,_void> *local_140;
  cpp_dec_float<50U,_int,_void> local_138;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f8;
  pointer local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (pSVar2->coWeights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(pSVar2->thecovectors->set).thenum;
  if (lVar8 < 1) {
    DVar6.info = 0;
    DVar6.idx = -1;
  }
  else {
    local_148 = 0xffffffff;
    lVar7 = 0;
    lVar9 = 0x30;
    local_150.info = 0;
    local_150.idx = 0;
    local_140 = &best->m_backend;
    local_f8 = this;
    do {
      local_188.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar9 + -0x10);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar9 + -0x30);
      local_188.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_188.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar9 + -0x20);
      local_188.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_188.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_188.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_188.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar9 + -8);
      local_188.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar9 + -4);
      local_188._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar9);
      local_138.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_138.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_138.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_138.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_138.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_138.exp = (tol->m_backend).exp;
      local_138.neg = (tol->m_backend).neg;
      local_138.fpclass = (tol->m_backend).fpclass;
      local_138.prec_elem = (tol->m_backend).prec_elem;
      if (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite) {
        local_138.neg = (bool)(local_138.neg ^ 1);
      }
      if ((local_138.fpclass != cpp_dec_float_NaN && local_188.fpclass != cpp_dec_float_NaN) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_188,&local_138), iVar5 < 0)) {
        uStack_50 = CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
        local_68 = (steeppr  [8])local_188.data._M_elems._0_8_;
        auStack_60[0] = local_188.data._M_elems[2];
        auStack_60[1] = local_188.data._M_elems[3];
        local_58[0] = local_188.data._M_elems[4];
        local_58[1] = local_188.data._M_elems[5];
        local_48[0] = local_188.data._M_elems[8];
        local_48[1] = local_188.data._M_elems[9];
        local_40 = local_188.exp;
        local_3c = local_188.neg;
        local_38 = local_188.fpclass;
        iStack_34 = local_188.prec_elem;
        puVar1 = (uint *)((long)&(local_f0->m_backend).data + lVar9 + -0x30);
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(local_f0->m_backend).data + lVar9 + -0x20);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(local_f0->m_backend).data + lVar9 + -0x10);
        local_a8.m_backend.exp = *(int *)((long)&(local_f0->m_backend).data + lVar9 + -8);
        local_a8.m_backend.neg = *(bool *)((long)&(local_f0->m_backend).data + lVar9 + -4);
        local_a8.m_backend._48_8_ = *(undefined8 *)((long)&(local_f0->m_backend).data + lVar9);
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2)
        ;
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (tol->m_backend).exp;
        local_e8.m_backend.neg = (tol->m_backend).neg;
        local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_138,local_68,&local_a8,&local_e8,in_R8);
        local_188.data._M_elems[8] = local_138.data._M_elems[8];
        local_188.data._M_elems[9] = local_138.data._M_elems[9];
        local_188.data._M_elems[4] = local_138.data._M_elems[4];
        local_188.data._M_elems[5] = local_138.data._M_elems[5];
        local_188.data._M_elems._24_5_ = local_138.data._M_elems._24_5_;
        local_188.data._M_elems[7]._1_3_ = local_138.data._M_elems[7]._1_3_;
        local_188.data._M_elems[0] = local_138.data._M_elems[0];
        local_188.data._M_elems[1] = local_138.data._M_elems[1];
        local_188.data._M_elems[2] = local_138.data._M_elems[2];
        local_188.data._M_elems[3] = local_138.data._M_elems[3];
        local_188.exp = local_138.exp;
        local_188.neg = local_138.neg;
        local_188.fpclass = local_138.fpclass;
        local_188.prec_elem = local_138.prec_elem;
        if ((local_138.fpclass != cpp_dec_float_NaN) &&
           ((local_140->fpclass != cpp_dec_float_NaN &&
            (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_188,local_140), 0 < iVar5)))) {
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_140->data)->data)._M_elems + 8)
               = local_188.data._M_elems._32_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_140->data)->data)._M_elems + 4)
               = local_188.data._M_elems._16_8_;
          *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_140->data)->data)._M_elems + 6) =
               CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
          *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_140->data)->data)._M_elems =
               local_188.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_140->data)->data)._M_elems + 2)
               = local_188.data._M_elems._8_8_;
          local_140->exp = local_188.exp;
          local_140->neg = local_188.neg;
          local_140->fpclass = local_188.fpclass;
          local_140->prec_elem = local_188.prec_elem;
          local_150 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::coId((local_f8->
                                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).thesolver,(int)lVar7);
          local_148 = (ulong)local_150 >> 0x20;
        }
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x38;
    } while (lVar8 != lVar7);
    DVar6 = (DataKey)((ulong)local_150 & 0xffffffff | local_148 << 0x20);
  }
  return (SPxId)DVar6;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->dim(); i < end; ++i)
   {
      x = coTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(i);
         }
      }
   }

   return enterId;
}